

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O2

void mainchan_send_eof(Channel *chan)

{
  long lVar1;
  LogContext *ctx;
  char cVar2;
  char *event;
  
  if (chan->vt != &mainchan_channelvt) {
    __assert_fail("chan->vt == &mainchan_channelvt",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/mainchan.c"
                  ,0x164,"void mainchan_send_eof(Channel *)");
  }
  if (*(char *)((long)&chan[-1].vt + 1) == '\0') {
    lVar1 = *(long *)&chan[-4].initial_fixed_window_size;
    cVar2 = (**(code **)(**(long **)(lVar1 + 0x48) + 8))();
    if ((cVar2 != '\0') || (*(char *)((long)&chan[-1].vt + 2) == '\x01')) {
      (**(code **)(**(long **)&chan[-5].initial_fixed_window_size + 8))();
      ctx = *(LogContext **)(lVar1 + 0x40);
      event = dupprintf("Sent EOF message");
      logevent_and_free(ctx,event);
      *(undefined1 *)((long)&chan[-1].vt + 1) = 1;
      (**(code **)((chan[-3].vt)->open_confirmation + 0xb0))(chan[-3].vt,0);
      return;
    }
  }
  return;
}

Assistant:

static void mainchan_send_eof(Channel *chan)
{
    assert(chan->vt == &mainchan_channelvt);
    mainchan *mc = container_of(chan, mainchan, chan);
    PacketProtocolLayer *ppl = mc->ppl; /* for ppl_logevent */

    if (!mc->eof_sent && (seat_eof(mc->ppl->seat) || mc->got_pty)) {
        /*
         * Either seat_eof told us that the front end wants us to
         * close the outgoing side of the connection as soon as we see
         * EOF from the far end, or else we've unilaterally decided to
         * do that because we've allocated a remote pty and hence EOF
         * isn't a particularly meaningful concept.
         */
        sshfwd_write_eof(mc->sc);
        ppl_logevent("Sent EOF message");
        mc->eof_sent = true;
        ssh_set_wants_user_input(mc->cl, false); /* stop reading from stdin */
    }
}